

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<float>_>::GetSub
          (TPZMatrix<Fad<float>_> *this,TPZVec<long> *indices,TPZFMatrix<Fad<float>_> *block)

{
  Fad<float> *pFVar1;
  long lVar2;
  Fad<float> *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Fad<float> local_50;
  
  lVar2 = indices->fNElements;
  if (0 < lVar2) {
    lVar6 = 0;
    do {
      lVar4 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,indices->fStore[lVar6],indices->fStore[lVar4]);
        if (((block->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow <= lVar6) ||
           ((block->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<Fad<float>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar5 = (block->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow * lVar4;
        pFVar3 = block->fElem;
        pFVar1 = pFVar3 + lVar5 + lVar6;
        pFVar1->val_ = local_50.val_;
        Vector<float>::operator=(&pFVar1->dx_,&local_50.dx_);
        pFVar3[lVar5 + lVar6].defaultVal = local_50.defaultVal;
        Fad<float>::~Fad(&local_50);
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}